

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void idtx16_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int in_ECX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar6 [16];
  int i;
  int num_iters;
  __m256i a_low;
  __m256i offset;
  __m256i fact;
  undefined4 local_228;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrd_avx(ZEXT416(0x2d42),0x2d42,1);
  auVar1 = vpinsrd_avx(auVar1,0x2d42,2);
  auVar1 = vpinsrd_avx(auVar1,0x2d42,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x2d42),0x2d42,1);
  auVar2 = vpinsrd_avx(auVar2,0x2d42,2);
  auVar2 = vpinsrd_avx(auVar2,0x2d42,3);
  uStack_b0 = auVar2._0_8_;
  uStack_a8 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar2 = vpinsrd_avx(auVar2,0x800,2);
  auVar2 = vpinsrd_avx(auVar2,0x800,3);
  auVar3 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar3 = vpinsrd_avx(auVar3,0x800,2);
  auVar3 = vpinsrd_avx(auVar3,0x800,3);
  auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  uStack_70 = auVar6._0_8_;
  uStack_68 = auVar6._8_8_;
  for (local_228 = 0; local_228 < in_ECX << 4; local_228 = local_228 + 1) {
    auVar4._16_8_ = uStack_b0;
    auVar4._0_16_ = auVar1;
    auVar4._24_8_ = uStack_a8;
    auVar4 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_228 * 0x20),auVar4);
    auVar5._16_8_ = uStack_70;
    auVar5._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar5._24_8_ = uStack_68;
    auVar4 = vpaddd_avx2(auVar4,auVar5);
    auVar4 = vpsrad_avx2(auVar4,ZEXT416(0xc));
    *(undefined1 (*) [32])(in_RSI + (long)local_228 * 0x20) = auVar4;
  }
  return;
}

Assistant:

static void idtx16_avx2(__m256i *in, __m256i *out, const int8_t bit,
                        int col_num, const int outstride) {
  (void)bit;
  (void)outstride;
  __m256i fact = _mm256_set1_epi32(2 * NewSqrt2);
  __m256i offset = _mm256_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m256i a_low;

  int num_iters = 16 * col_num;
  for (int i = 0; i < num_iters; i++) {
    a_low = _mm256_mullo_epi32(in[i], fact);
    a_low = _mm256_add_epi32(a_low, offset);
    out[i] = _mm256_srai_epi32(a_low, NewSqrt2Bits);
  }
}